

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-inl.h
# Opt level: O3

size_t spdlog::details::os::filesize(FILE *f)

{
  int iVar1;
  int *piVar2;
  stat64 st;
  string local_e0;
  string local_c0;
  stat64 local_a0;
  
  if (f == (FILE *)0x0) {
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c0,"Failed getting file size. fd is null","");
    throw_spdlog_ex(&local_c0);
  }
  iVar1 = fileno((FILE *)f);
  iVar1 = fstat64(iVar1,&local_a0);
  if (iVar1 == 0) {
    return local_a0.st_size;
  }
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e0,"Failed getting file size from fd","");
  piVar2 = __errno_location();
  throw_spdlog_ex(&local_e0,*piVar2);
}

Assistant:

SPDLOG_INLINE size_t filesize(FILE *f) {
    if (f == nullptr) {
        throw_spdlog_ex("Failed getting file size. fd is null");
    }
#if defined(_WIN32) && !defined(__CYGWIN__)
    int fd = ::_fileno(f);
    #if defined(_WIN64)  // 64 bits
    __int64 ret = ::_filelengthi64(fd);
    if (ret >= 0) {
        return static_cast<size_t>(ret);
    }

    #else  // windows 32 bits
    long ret = ::_filelength(fd);
    if (ret >= 0) {
        return static_cast<size_t>(ret);
    }
    #endif

#else  // unix
    // OpenBSD and AIX doesn't compile with :: before the fileno(..)
    #if defined(__OpenBSD__) || defined(_AIX)
    int fd = fileno(f);
    #else
    int fd = ::fileno(f);
    #endif
    // 64 bits(but not in osx, linux/musl or cygwin, where fstat64 is deprecated)
    #if ((defined(__linux__) && defined(__GLIBC__)) || defined(__sun) || defined(_AIX)) && \
        (defined(__LP64__) || defined(_LP64))
    struct stat64 st;
    if (::fstat64(fd, &st) == 0) {
        return static_cast<size_t>(st.st_size);
    }
    #else  // other unix or linux 32 bits or cygwin
    struct stat st;
    if (::fstat(fd, &st) == 0) {
        return static_cast<size_t>(st.st_size);
    }
    #endif
#endif
    throw_spdlog_ex("Failed getting file size from fd", errno);
    return 0;  // will not be reached.
}